

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddConfigVariableFlags
          (cmLocalGenerator *this,string *flags,string *var,string *config)

{
  string *psVar1;
  string flagsVar;
  char local_71;
  string local_70;
  string local_50;
  
  psVar1 = cmMakefile::GetSafeDefinition(this->Makefile,var);
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,flags,psVar1);
  if (config->_M_string_length != 0) {
    local_71 = '_';
    cmsys::SystemTools::UpperCase(&local_50,config);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
              (&local_70,var,&local_71,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    psVar1 = cmMakefile::GetSafeDefinition(this->Makefile,&local_70);
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,flags,psVar1);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddConfigVariableFlags(std::string& flags,
                                              const std::string& var,
                                              const std::string& config)
{
  // Add the flags from the variable itself.
  this->AppendFlags(flags, this->Makefile->GetSafeDefinition(var));
  // Add the flags from the build-type specific variable.
  if (!config.empty()) {
    const std::string flagsVar =
      cmStrCat(var, '_', cmSystemTools::UpperCase(config));
    this->AppendFlags(flags, this->Makefile->GetSafeDefinition(flagsVar));
  }
}